

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFromCord(Parser *this,Cord *input,Message *output)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  size_t sVar3;
  string local_1d8;
  AlphaNum local_1b8;
  AlphaNum local_188;
  AlphaNum local_158;
  AlphaNum local_128;
  CordInputStream input_stream;
  
  pEVar1 = this->error_collector_;
  sVar3 = absl::lts_20250127::Cord::InlineRep::size(&input->contents_);
  if (sVar3 >> 0x1f == 0) {
    io::CordInputStream::CordInputStream(&input_stream,input);
    bVar2 = Parse(this,&input_stream.super_ZeroCopyInputStream,output);
  }
  else {
    input_stream._0_16_ = absl::lts_20250127::NullSafeStringView("Input size too large: ");
    sVar3 = absl::lts_20250127::Cord::InlineRep::size(&input->contents_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1b8,sVar3);
    local_128.piece_ = absl::lts_20250127::NullSafeStringView(" bytes");
    local_158.piece_ = absl::lts_20250127::NullSafeStringView(" > ");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_188,0x7fffffff);
    absl::lts_20250127::StrCat<char[8]>
              (&local_1d8,(AlphaNum *)&input_stream,&local_1b8,&local_128,&local_158,&local_188,
               (char (*) [8])0xe73ab1);
    (*pEVar1->_vptr_ErrorCollector[2])
              (pEVar1,0xffffffffffffffff,0,local_1d8._M_string_length,local_1d8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1d8);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TextFormat::Parser::ParseFromCord(const absl::Cord& input,
                                       Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::CordInputStream input_stream(&input);
  return Parse(&input_stream, output);
}